

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O2

int ERKStepReInit(void *arkode_mem,ARKRhsFn f,sunrealtype t0,N_Vector y0)

{
  int iVar1;
  int line;
  char *msgfmt;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  
  iVar1 = erkStep_AccessARKODEStepMem(arkode_mem,"ERKStepReInit",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    if (ark_mem->MallocDone == 0) {
      msgfmt = "Attempt to call before ARKodeInit.";
      iVar1 = -0x17;
      line = 0xb5;
    }
    else if (f == (ARKRhsFn)0x0) {
      msgfmt = "Must specify at least one of fe, fi (both NULL).";
      iVar1 = -0x16;
      line = 0xbd;
    }
    else {
      if (y0 != (N_Vector)0x0) {
        step_mem->f = f;
        iVar1 = arkInit((ARKodeMem)arkode_mem,t0,y0,0);
        if (iVar1 != 0) {
          arkProcessError(ark_mem,iVar1,0xd1,"ERKStepReInit",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                          ,"Unable to initialize main ARKODE infrastructure");
          return iVar1;
        }
        step_mem->nfe = 0;
        return 0;
      }
      msgfmt = "y0 = NULL illegal.";
      iVar1 = -0x16;
      line = 0xc5;
    }
    arkProcessError(ark_mem,iVar1,line,"ERKStepReInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                    ,msgfmt);
  }
  return iVar1;
}

Assistant:

int ERKStepReInit(void* arkode_mem, ARKRhsFn f, sunrealtype t0, N_Vector y0)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }

  /* Check that f is supplied */
  if (f == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return (ARK_ILL_INPUT);
  }

  /* Check for legal input parameters */
  if (y0 == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return (ARK_ILL_INPUT);
  }

  /* Copy the input parameters into ARKODE state */
  step_mem->f = f;

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(arkode_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to initialize main ARKODE infrastructure");
    return (retval);
  }

  /* Initialize all the counters */
  step_mem->nfe = 0;

  return (ARK_SUCCESS);
}